

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UVector * icu_63::ZoneMeta::createMetazoneMappings(UnicodeString *tzid)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *resB;
  UChar *pUVar3;
  undefined8 *obj;
  UVector *this;
  char16_t *status_00;
  UDate UVar4;
  UDate UVar5;
  UVector *local_1c0;
  OlsonToMetaMappingEntry *entry;
  UDate to;
  UDate from;
  UChar *mz_to;
  UChar *mz_from;
  UChar *mz_name;
  UResourceBundle *mz;
  char *p;
  undefined1 local_f8 [4];
  int32_t tzKeyLen;
  char tzKey [129];
  UResourceBundle *rb;
  UnicodeString canonicalID;
  UVector *pUStack_18;
  UErrorCode status;
  UVector *mzMappings;
  UnicodeString *tzid_local;
  
  pUStack_18 = (UVector *)0x0;
  canonicalID.fUnion._52_4_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)&rb);
  resB = ures_openDirect_63((char *)0x0,"metaZones",
                            (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
  ures_getByKey_63(resB,"metazoneInfo",resB,
                   (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
  getCanonicalCLDRID(tzid,(UnicodeString *)&rb,
                     (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
  UVar1 = ::U_SUCCESS(canonicalID.fUnion._52_4_);
  if (UVar1 != '\0') {
    iVar2 = UnicodeString::length((UnicodeString *)&rb);
    iVar2 = UnicodeString::extract((UnicodeString *)&rb,0,iVar2,local_f8,0x81,kInvariant);
    local_f8[iVar2] = 0;
    for (mz = (UResourceBundle *)local_f8; *(char *)&mz->fKey != '\0';
        mz = (UResourceBundle *)((long)&mz->fKey + 1)) {
      if (*(char *)&mz->fKey == '/') {
        *(undefined1 *)&mz->fKey = 0x3a;
      }
    }
    ures_getByKey_63(resB,local_f8,resB,
                     (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
    UVar1 = ::U_SUCCESS(canonicalID.fUnion._52_4_);
    if (UVar1 != '\0') {
      mz_name = (UChar *)0x0;
      do {
        while( true ) {
          while( true ) {
            UVar1 = ures_hasNext_63(resB);
            if (UVar1 == '\0') goto LAB_00258677;
            mz_name = (UChar *)ures_getNextResource_63
                                         (resB,(UResourceBundle *)mz_name,
                                          (UErrorCode *)
                                          (canonicalID.fUnion.fStackFields.fBuffer + 0x19));
            pUVar3 = ures_getStringByIndex_63
                               ((UResourceBundle *)mz_name,0,(int32_t *)0x0,
                                (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
            mz_to = L"1970-01-01 00:00";
            from = (UDate)gDefaultTo;
            iVar2 = ures_getSize_63((UResourceBundle *)mz_name);
            if (iVar2 == 3) {
              mz_to = ures_getStringByIndex_63
                                ((UResourceBundle *)mz_name,1,(int32_t *)0x0,
                                 (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
              from = (UDate)ures_getStringByIndex_63
                                      ((UResourceBundle *)mz_name,2,(int32_t *)0x0,
                                       (UErrorCode *)
                                       (canonicalID.fUnion.fStackFields.fBuffer + 0x19));
            }
            UVar1 = ::U_FAILURE(canonicalID.fUnion._52_4_);
            if (UVar1 == '\0') break;
            canonicalID.fUnion._52_4_ = 0;
          }
          UVar4 = parseDate(mz_to,(UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
          status_00 = canonicalID.fUnion.fStackFields.fBuffer + 0x19;
          UVar5 = parseDate((UChar *)from,(UErrorCode *)status_00);
          UVar1 = ::U_FAILURE(canonicalID.fUnion._52_4_);
          if (UVar1 == '\0') break;
          canonicalID.fUnion._52_4_ = 0;
        }
        obj = (undefined8 *)uprv_malloc_63(0x18);
        if (obj == (undefined8 *)0x0) {
          canonicalID.fUnion._52_4_ = 7;
          break;
        }
        *obj = pUVar3;
        obj[1] = UVar4;
        obj[2] = UVar5;
        if (pUStack_18 == (UVector *)0x0) {
          this = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
          local_1c0 = (UVector *)0x0;
          if (this != (UVector *)0x0) {
            UVector::UVector(this,deleteOlsonToMetaMappingEntry,(UElementsAreEqual *)0x0,
                             (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
            local_1c0 = this;
          }
          pUStack_18 = local_1c0;
          UVar1 = ::U_FAILURE(canonicalID.fUnion._52_4_);
          if (UVar1 != '\0') {
            if (local_1c0 != (UVector *)0x0) {
              (*(local_1c0->super_UObject)._vptr_UObject[1])();
            }
            pUStack_18 = (UVector *)0x0;
            uprv_free_63(obj);
            break;
          }
        }
        UVector::addElement(pUStack_18,obj,
                            (UErrorCode *)(canonicalID.fUnion.fStackFields.fBuffer + 0x19));
        UVar1 = ::U_FAILURE(canonicalID.fUnion._52_4_);
      } while (UVar1 == '\0');
LAB_00258677:
      ures_close_63((UResourceBundle *)mz_name);
      UVar1 = ::U_FAILURE(canonicalID.fUnion._52_4_);
      if ((UVar1 != '\0') && (pUStack_18 != (UVector *)0x0)) {
        if (pUStack_18 != (UVector *)0x0) {
          (*(pUStack_18->super_UObject)._vptr_UObject[1])();
        }
        pUStack_18 = (UVector *)0x0;
      }
    }
  }
  ures_close_63(resB);
  UnicodeString::~UnicodeString((UnicodeString *)&rb);
  return pUStack_18;
}

Assistant:

UVector*
ZoneMeta::createMetazoneMappings(const UnicodeString &tzid) {
    UVector *mzMappings = NULL;
    UErrorCode status = U_ZERO_ERROR;

    UnicodeString canonicalID;
    UResourceBundle *rb = ures_openDirect(NULL, gMetaZones, &status);
    ures_getByKey(rb, gMetazoneInfo, rb, &status);
    getCanonicalCLDRID(tzid, canonicalID, status);

    if (U_SUCCESS(status)) {
        char tzKey[ZID_KEY_MAX + 1];
        int32_t tzKeyLen = canonicalID.extract(0, canonicalID.length(), tzKey, sizeof(tzKey), US_INV);
        tzKey[tzKeyLen] = 0;

        // tzid keys are using ':' as separators
        char *p = tzKey;
        while (*p) {
            if (*p == '/') {
                *p = ':';
            }
            p++;
        }

        ures_getByKey(rb, tzKey, rb, &status);

        if (U_SUCCESS(status)) {
            UResourceBundle *mz = NULL;
            while (ures_hasNext(rb)) {
                mz = ures_getNextResource(rb, mz, &status);

                const UChar *mz_name = ures_getStringByIndex(mz, 0, NULL, &status);
                const UChar *mz_from = gDefaultFrom;
                const UChar *mz_to = gDefaultTo;

                if (ures_getSize(mz) == 3) {
                    mz_from = ures_getStringByIndex(mz, 1, NULL, &status);
                    mz_to   = ures_getStringByIndex(mz, 2, NULL, &status);
                }

                if(U_FAILURE(status)){
                    status = U_ZERO_ERROR;
                    continue;
                }
                // We do not want to use SimpleDateformat to parse boundary dates,
                // because this code could be triggered by the initialization code
                // used by SimpleDateFormat.
                UDate from = parseDate(mz_from, status);
                UDate to = parseDate(mz_to, status);
                if (U_FAILURE(status)) {
                    status = U_ZERO_ERROR;
                    continue;
                }

                OlsonToMetaMappingEntry *entry = (OlsonToMetaMappingEntry*)uprv_malloc(sizeof(OlsonToMetaMappingEntry));
                if (entry == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                entry->mzid = mz_name;
                entry->from = from;
                entry->to = to;

                if (mzMappings == NULL) {
                    mzMappings = new UVector(deleteOlsonToMetaMappingEntry, NULL, status);
                    if (U_FAILURE(status)) {
                        delete mzMappings;
                        mzMappings = NULL;
                        uprv_free(entry);
                        break;
                    }
                }

                mzMappings->addElement(entry, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
            ures_close(mz);
            if (U_FAILURE(status)) {
                if (mzMappings != NULL) {
                    delete mzMappings;
                    mzMappings = NULL;
                }
            }
        }
    }
    ures_close(rb);
    return mzMappings;
}